

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O3

uint32 __thiscall
Memory::Recycler::GetEndAddressOffset<(Memory::ObjectInfoBits)0>(Recycler *this,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((sizeCat == 0) || (0x300 < sizeCat || (sizeCat & 0xf) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                       ,0x599,"(HeapInfo::IsAlignedSmallObjectSize(sizeCat))",
                       "HeapInfo::IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  HeapInfo::GetBucket<(Memory::ObjectInfoBits)0>(&(this->autoHeap).defaultHeap,sizeCat);
  return 0;
}

Assistant:

uint32 GetEndAddressOffset(size_t sizeCat)
    {
        Assert(HeapInfo::IsAlignedSmallObjectSize(sizeCat));
        return this->GetHeapInfo<attributes>()->template GetBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat).GetAllocator()->GetEndAddressOffset();
    }